

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigVec.c
# Opt level: O1

int Fraig_NodeVecCompareRefCounts(Fraig_Node_t **pp1,Fraig_Node_t **pp2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar1 = *(int *)(((ulong)*pp2 & 0xfffffffffffffffe) + 0xc);
  uVar3 = 0xffffffff;
  iVar2 = *(int *)(((ulong)*pp1 & 0xfffffffffffffffe) + 0xc);
  if ((iVar1 <= iVar2) && (uVar3 = 1, iVar2 <= iVar1)) {
    iVar1 = *(int *)(((ulong)*pp2 & 0xfffffffffffffffe) + 8);
    uVar3 = 0xffffffff;
    iVar2 = *(int *)(((ulong)*pp1 & 0xfffffffffffffffe) + 8);
    if (iVar1 <= iVar2) {
      uVar3 = (uint)(iVar1 < iVar2);
    }
  }
  return uVar3;
}

Assistant:

int Fraig_NodeVecCompareRefCounts( Fraig_Node_t ** pp1, Fraig_Node_t ** pp2 )
{
    int nRefs1 = Fraig_Regular(*pp1)->nRefs;
    int nRefs2 = Fraig_Regular(*pp2)->nRefs;

    if ( nRefs1 < nRefs2 )
        return -1;
    if ( nRefs1 > nRefs2 )
        return 1;

    nRefs1 = Fraig_Regular(*pp1)->Level;
    nRefs2 = Fraig_Regular(*pp2)->Level;

    if ( nRefs1 < nRefs2 )
        return -1;
    if ( nRefs1 > nRefs2 )
        return 1;
    return 0; 
}